

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

void __thiscall CTcPrsGramNodeCat::flatten_cat(CTcPrsGramNodeCat *this)

{
  long *plVar1;
  int iVar2;
  long in_RDI;
  bool bVar3;
  CTcPrsGramNodeCat *cur_cat;
  CTcPrsGramNode *nxt;
  CTcPrsGramNode *cur;
  CTcPrsGramNode *prv;
  long *local_18;
  long *local_10;
  
  local_10 = (long *)0x0;
  local_18 = *(long **)(in_RDI + 0x40);
  while (local_18 != (long *)0x0) {
    plVar1 = (long *)local_18[7];
    (**(code **)(*local_18 + 0x20))();
    iVar2 = (**(code **)(*local_18 + 0x30))();
    if (iVar2 == 0) {
      local_10 = local_18;
      local_18 = plVar1;
    }
    else if (local_18[8] == 0) {
      if (local_10 == (long *)0x0) {
        *(long **)(in_RDI + 0x40) = plVar1;
      }
      else {
        local_10[7] = (long)plVar1;
      }
      bVar3 = *(long **)(in_RDI + 0x48) == local_18;
      local_18 = plVar1;
      if (bVar3) {
        *(long **)(in_RDI + 0x48) = local_10;
      }
    }
    else {
      if (local_10 == (long *)0x0) {
        *(long *)(in_RDI + 0x40) = local_18[8];
      }
      else {
        local_10[7] = local_18[8];
      }
      *(long **)(local_18[9] + 0x38) = plVar1;
      if (*(long **)(in_RDI + 0x48) == local_18) {
        *(long *)(in_RDI + 0x48) = local_18[9];
      }
      local_10 = (long *)local_18[9];
      local_18 = plVar1;
    }
  }
  return;
}

Assistant:

virtual void flatten_cat()
    {
        CTcPrsGramNode *prv;
        CTcPrsGramNode *cur;
        CTcPrsGramNode *nxt;
        
        /*
         *   Check each child.  For each child that's a CAT node, move its
         *   contents directly into our list, removing the redundant
         *   intervening CAT node. 
         */
        for (prv = 0, cur = sub_head_ ; cur != 0 ; cur = nxt)
        {
            /* note the next item, in case we fiddle with the list */
            nxt = cur->next_;

            /* flatten the CAT items below this one */
            cur->flatten_cat();

            /* if this item is a CAT, move its contents directly into us */
            if (cur->is_cat())
            {
                CTcPrsGramNodeCat *cur_cat;
                
                /* cast it to a CAT node */
                cur_cat = (CTcPrsGramNodeCat *)cur;

                /* if it's empty, just remove it; otherwise, link it in */
                if (cur_cat->sub_head_ != 0)
                {
                    /* link from the previous item to the sublist head */
                    if (prv == 0)
                    {
                        /* 
                         *   this is the first item - put it at the start of
                         *   our list 
                         */
                        sub_head_ = cur_cat->sub_head_;
                    }
                    else
                    {
                        /* link it after the previous item */
                        prv->next_ = cur_cat->sub_head_;
                    }
                    
                    /* link from the tail of the sublist to the next item */
                    cur_cat->sub_tail_->next_ = nxt;
                    
                    /* if it's the last item, set our tail pointer */
                    if (sub_tail_ == cur)
                        sub_tail_ = cur_cat->sub_tail_;
                    
                    /* 
                     *   the tail of the sublist is now the previous item in
                     *   the list for the purposes of the next iteration 
                     */
                    prv = cur_cat->sub_tail_;
                }
                else
                {
                    /* unlink it from our list */
                    if (prv != 0)
                        prv->next_ = nxt;
                    else
                        sub_head_ = nxt;

                    /* update the tail pointer if removing the last item */
                    if (sub_tail_ == cur_cat)
                        sub_tail_ = prv;

                    /* note that the previous item is unchanged */
                }
            }
            else
            {
                /* 
                 *   it's not a CAT, so we're not changing it; this is the
                 *   previous item for the next iteration 
                 */
                prv = cur;
            }
        }
    }